

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_simple.c
# Opt level: O2

int run_test(EVP_MD_CTX *ctx,OSSL_PROVIDER *prov,EVP_MD *md)

{
  uchar *puVar1;
  uchar *puVar2;
  int iVar3;
  uint uVar4;
  uchar *md_00;
  long lVar5;
  FILE *__stream;
  char *pcVar6;
  undefined8 uStack_30;
  char msg [14];
  
  builtin_strncpy(msg + 8,"orld!\n",6);
  builtin_strncpy(msg,"Hello, W",8);
  md_00 = (uchar *)calloc(0x20,1);
  iVar3 = EVP_DigestInit_ex((EVP_MD_CTX *)ctx,(EVP_MD *)md,(ENGINE *)0x0);
  if (iVar3 == 1) {
    iVar3 = EVP_DigestUpdate((EVP_MD_CTX *)ctx,msg,0xe);
    if (iVar3 == 1) {
      iVar3 = EVP_DigestFinal_ex((EVP_MD_CTX *)ctx,md_00,(uint *)0x0);
      if (iVar3 == 1) {
        lVar5 = 0;
        do {
          if (lVar5 == 0x20) {
            puts("Success!");
            free(md_00);
            return 0;
          }
          puVar1 = md_00 + lVar5;
          puVar2 = &DAT_00102020 + lVar5;
          lVar5 = lVar5 + 1;
        } while (*puVar1 == *puVar2);
        fwrite("Output doesn\'t match input\n",0x1b,1,_stderr);
        free(md_00);
        return 1;
      }
      ERR_print_errors_fp(_stderr);
      __stream = _stderr;
      uVar4 = EVP_DigestFinal_ex((EVP_MD_CTX *)ctx,md_00,(uint *)0x0);
      pcVar6 = "EVP_DigestFinal_ex(ctx, out, NULL)";
      uStack_30 = 0x27;
    }
    else {
      ERR_print_errors_fp(_stderr);
      __stream = _stderr;
      uVar4 = EVP_DigestUpdate((EVP_MD_CTX *)ctx,msg,0xe);
      pcVar6 = "EVP_DigestUpdate(ctx, msg, sizeof(msg))";
      uStack_30 = 0x26;
    }
  }
  else {
    ERR_print_errors_fp(_stderr);
    __stream = _stderr;
    uVar4 = EVP_DigestInit_ex((EVP_MD_CTX *)ctx,(EVP_MD *)md,(ENGINE *)0x0);
    pcVar6 = "EVP_DigestInit_ex(ctx, md, NULL)";
    uStack_30 = 0x25;
  }
  fprintf(__stream,"Failed %s:%i %s %i\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/J-Montgomery[P]blake3-prov/test/digest_simple.c"
          ,uStack_30,pcVar6,(ulong)uVar4);
  return 1;
}

Assistant:

int run_test(EVP_MD_CTX *ctx, OSSL_PROVIDER *prov, EVP_MD *md)
{
	uint8_t *out;

	// "Hello, World!\n"
	const char msg[] = { 0x48, 0x65, 0x6c, 0x6c, 0x6f, 0x2c, 0x20,
			     0x57, 0x6f, 0x72, 0x6c, 0x64, 0x21, 0x0a };
	const uint8_t expected[] = { 0x62, 0x33, 0x83, 0x4b, 0xce, 0x78, 0x17,
				     0xdb, 0x1e, 0x40, 0x1b, 0xce, 0xea, 0x2b,
				     0x8b, 0x45, 0xc1, 0x60, 0x1,  0x15, 0xd2,
				     0x5b, 0x51, 0x90, 0x6c, 0x5,  0xee, 0x32,
				     0x15, 0x6b, 0x51, 0xc2 };

	out = (uint8_t *)calloc(BLAKE3_DIGEST_LENGTH, 1);
	TEST_TRUE(EVP_DigestInit_ex(ctx, md, NULL));
	TEST_TRUE(EVP_DigestUpdate(ctx, msg, sizeof(msg)));
	TEST_TRUE(EVP_DigestFinal_ex(ctx, out, NULL));

	for (int i = 0; i < sizeof(expected); i++) {
		if (out[i] != expected[i]) {
			fprintf(stderr, "Output doesn't match input\n");
			free(out);
			return 1;
		}
	}

	printf("Success!\n");

	free(out);
	return 0;
}